

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

Interaction * __thiscall
phyr::Sphere::sample(Interaction *__return_storage_ptr__,Sphere *this,Point2f *u,double *pdf)

{
  double extraout_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3f local_78;
  Normal3<double> local_58;
  Point3<double> local_40;
  
  dVar2 = this->radius;
  uniformSampleSphere(&local_78,u);
  dVar1 = dVar2 * local_78.x + 0.0;
  dVar3 = dVar2 * local_78.y + 0.0;
  dVar2 = local_78.z * dVar2 + 0.0;
  (__return_storage_ptr__->pfError).y = 0.0;
  (__return_storage_ptr__->pfError).z = 0.0;
  (__return_storage_ptr__->wo).z = 0.0;
  (__return_storage_ptr__->pfError).x = 0.0;
  (__return_storage_ptr__->wo).x = 0.0;
  (__return_storage_ptr__->wo).y = 0.0;
  (__return_storage_ptr__->n).y = 0.0;
  (__return_storage_ptr__->n).z = 0.0;
  (__return_storage_ptr__->p).z = 0.0;
  (__return_storage_ptr__->n).x = 0.0;
  (__return_storage_ptr__->p).x = 0.0;
  (__return_storage_ptr__->p).y = 0.0;
  local_58.x = dVar1;
  local_58.y = dVar3;
  local_58.z = dVar2;
  Transform::operator()((this->super_Shape).localToWorld,&local_58);
  normalize<double>(&__return_storage_ptr__->n,(Normal3<double> *)&local_78);
  if ((this->super_Shape).reverseNormals == true) {
    Normal3<double>::operator*=(&__return_storage_ptr__->n,-1);
  }
  local_78.y = this->radius / SQRT(dVar2 * dVar2 + dVar1 * dVar1 + dVar3 * dVar3);
  local_78.z = dVar2 * local_78.y;
  local_78.x = local_78.y * dVar1;
  local_78.y = local_78.y * dVar3;
  local_58.z = ABS(local_78.z) * 5.551115123125786e-16;
  local_58.x = ABS(local_78.x) * 5.551115123125786e-16;
  local_58.y = ABS(local_78.y) * 5.551115123125786e-16;
  Transform::operator()
            (&local_40,(this->super_Shape).localToWorld,(Point3<double> *)&local_78,
             (Vector3<double> *)&local_58,&__return_storage_ptr__->pfError);
  (__return_storage_ptr__->p).z = local_40.z;
  (__return_storage_ptr__->p).x = local_40.x;
  (__return_storage_ptr__->p).y = local_40.y;
  (*(this->super_Shape)._vptr_Shape[4])(this);
  *pdf = 1.0 / extraout_XMM0_Qa;
  return __return_storage_ptr__;
}

Assistant:

Interaction Sphere::sample(const Point2f& u, Real* pdf) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * uniformSampleSphere(u);
    Interaction it;

    it.n = normalize((*localToWorld)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseNormals) it.n *= -1;

    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * abs((Vector3f)pObj);
    it.p = (*localToWorld)(pObj, pObjError, &it.pfError);
    *pdf = 1 / surfaceArea();

    return it;
}